

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  uint uVar3;
  Scene *pSVar4;
  Geometry *pGVar5;
  undefined1 auVar6 [32];
  long lVar7;
  undefined1 (*pauVar8) [16];
  int iVar9;
  undefined4 uVar10;
  AABBNodeMB4D *node1;
  ulong uVar11;
  long lVar12;
  RayHitK<8> *pRVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  float *vertices;
  ulong uVar24;
  size_t sVar25;
  ulong uVar26;
  size_t sVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar48 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [64];
  float fVar99;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar100 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar109 [16];
  float fVar113;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar116 [16];
  float fVar120;
  float fVar121;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar122 [16];
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  RayHitK<8> local_1401;
  ulong local_1400;
  undefined1 (*local_13f8) [16];
  ulong local_13f0;
  ulong local_13e8;
  undefined1 local_13e0 [16];
  undefined1 local_13d0 [16];
  undefined1 local_13c0 [16];
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [16];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  ulong local_1350;
  ulong local_1348;
  ulong local_1340;
  ulong local_1338;
  size_t local_1330;
  size_t local_1328;
  RayHitK<8> *local_1320;
  long local_1318;
  Scene *local_1310;
  long local_1308;
  undefined8 *local_1300;
  void *local_12f8;
  RTCRayQueryContext *local_12f0;
  RayHitK<8> *local_12e8;
  undefined1 (*local_12e0) [32];
  undefined4 local_12d8;
  undefined1 local_12d0 [16];
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  float local_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  undefined1 local_12a0 [16];
  undefined1 local_1290 [16];
  RayHitK<8> *local_1280;
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  float local_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  float local_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float local_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  undefined1 local_1180 [16];
  undefined1 local_1170 [16];
  undefined1 local_1160 [16];
  undefined1 local_1150 [16];
  undefined1 local_1140 [16];
  undefined1 local_1130 [16];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined8 local_10f0;
  undefined8 uStack_10e8;
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined4 local_1020;
  undefined4 uStack_101c;
  undefined4 uStack_1018;
  undefined4 uStack_1014;
  undefined4 uStack_1010;
  undefined4 uStack_100c;
  undefined4 uStack_1008;
  undefined4 uStack_1004;
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  ulong uVar13;
  
  local_13f8 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar10 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1160._4_4_ = uVar10;
  local_1160._0_4_ = uVar10;
  local_1160._8_4_ = uVar10;
  local_1160._12_4_ = uVar10;
  auVar91 = ZEXT1664(local_1160);
  uVar10 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1170._4_4_ = uVar10;
  local_1170._0_4_ = uVar10;
  local_1170._8_4_ = uVar10;
  local_1170._12_4_ = uVar10;
  auVar92 = ZEXT1664(local_1170);
  uVar10 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1180._4_4_ = uVar10;
  local_1180._0_4_ = uVar10;
  local_1180._8_4_ = uVar10;
  local_1180._12_4_ = uVar10;
  auVar98 = ZEXT1664(local_1180);
  local_11c0 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_11d0 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_11e0 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1190 = local_11c0 * 0.99999964;
  local_11a0 = local_11d0 * 0.99999964;
  local_11b0 = local_11e0 * 0.99999964;
  local_11c0 = local_11c0 * 1.0000004;
  local_11d0 = local_11d0 * 1.0000004;
  local_11e0 = local_11e0 * 1.0000004;
  local_1338 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1340 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1348 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_1350 = local_1338 ^ 0x10;
  local_13e8 = local_1340 ^ 0x10;
  local_13f0 = local_1348 ^ 0x10;
  iVar9 = (tray->tnear).field_0.i[k];
  local_12d0._4_4_ = iVar9;
  local_12d0._0_4_ = iVar9;
  local_12d0._8_4_ = iVar9;
  local_12d0._12_4_ = iVar9;
  auVar83 = ZEXT1664(local_12d0);
  iVar9 = (tray->tfar).field_0.i[k];
  auVar38 = ZEXT1664(CONCAT412(iVar9,CONCAT48(iVar9,CONCAT44(iVar9,iVar9))));
  iVar9 = 1 << ((uint)k & 0x1f);
  auVar48._4_4_ = iVar9;
  auVar48._0_4_ = iVar9;
  auVar48._8_4_ = iVar9;
  auVar48._12_4_ = iVar9;
  auVar48._16_4_ = iVar9;
  auVar48._20_4_ = iVar9;
  auVar48._24_4_ = iVar9;
  auVar48._28_4_ = iVar9;
  auVar37 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar48 = vpand_avx2(auVar48,auVar37);
  local_10e0 = vpcmpeqd_avx2(auVar48,auVar37);
  fStack_118c = local_1190;
  fStack_1188 = local_1190;
  fStack_1184 = local_1190;
  fStack_119c = local_11a0;
  fStack_1198 = local_11a0;
  fStack_1194 = local_11a0;
  fStack_11ac = local_11b0;
  fStack_11a8 = local_11b0;
  fStack_11a4 = local_11b0;
  fStack_11bc = local_11c0;
  fStack_11b8 = local_11c0;
  fStack_11b4 = local_11c0;
  fStack_11cc = local_11d0;
  fStack_11c8 = local_11d0;
  fStack_11c4 = local_11d0;
  fStack_11dc = local_11e0;
  fStack_11d8 = local_11e0;
  fStack_11d4 = local_11e0;
  uVar13 = local_13e8;
  uVar17 = local_13f0;
  uVar18 = local_1338;
  uVar19 = local_1340;
  uVar21 = local_1350;
  sVar27 = k;
  uVar22 = local_1348;
  fVar99 = local_1190;
  fVar101 = local_1190;
  fVar102 = local_1190;
  fVar103 = local_1190;
  fVar104 = local_11a0;
  fVar105 = local_11a0;
  fVar106 = local_11a0;
  fVar107 = local_11a0;
  fVar108 = local_11b0;
  fVar110 = local_11b0;
  fVar111 = local_11b0;
  fVar112 = local_11b0;
  fVar113 = local_11c0;
  fVar121 = local_11c0;
  fVar124 = local_11c0;
  fVar126 = local_11c0;
  fVar128 = local_11d0;
  fVar117 = local_11d0;
  fVar118 = local_11d0;
  fVar119 = local_11d0;
  fVar120 = local_11e0;
  fVar123 = local_11e0;
  fVar125 = local_11e0;
  fVar127 = local_11e0;
  local_1328 = k;
  local_1320 = ray;
  do {
    do {
      do {
        if (local_13f8 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar8 = local_13f8 + -1;
        local_13f8 = local_13f8 + -1;
      } while (*(float *)(ray + sVar27 * 4 + 0x100) < *(float *)(*pauVar8 + 8));
      uVar20 = *(ulong *)*local_13f8;
      do {
        if ((uVar20 & 8) == 0) {
          uVar11 = uVar20 & 0xfffffffffffffff0;
          uVar10 = *(undefined4 *)(ray + sVar27 * 4 + 0xe0);
          auVar39._4_4_ = uVar10;
          auVar39._0_4_ = uVar10;
          auVar39._8_4_ = uVar10;
          auVar39._12_4_ = uVar10;
          auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar18),auVar39,
                                    *(undefined1 (*) [16])(uVar11 + 0x20 + uVar18));
          auVar35 = vsubps_avx(auVar35,auVar91._0_16_);
          auVar40._0_4_ = fVar99 * auVar35._0_4_;
          auVar40._4_4_ = fVar101 * auVar35._4_4_;
          auVar40._8_4_ = fVar102 * auVar35._8_4_;
          auVar40._12_4_ = fVar103 * auVar35._12_4_;
          auVar35 = vmaxps_avx(auVar83._0_16_,auVar40);
          auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar19),auVar39,
                                    *(undefined1 (*) [16])(uVar11 + 0x20 + uVar19));
          auVar40 = vsubps_avx(auVar40,auVar92._0_16_);
          auVar54._0_4_ = fVar104 * auVar40._0_4_;
          auVar54._4_4_ = fVar105 * auVar40._4_4_;
          auVar54._8_4_ = fVar106 * auVar40._8_4_;
          auVar54._12_4_ = fVar107 * auVar40._12_4_;
          auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar22),auVar39,
                                    *(undefined1 (*) [16])(uVar11 + 0x20 + uVar22));
          auVar40 = vsubps_avx(auVar40,auVar98._0_16_);
          auVar60._0_4_ = fVar108 * auVar40._0_4_;
          auVar60._4_4_ = fVar110 * auVar40._4_4_;
          auVar60._8_4_ = fVar111 * auVar40._8_4_;
          auVar60._12_4_ = fVar112 * auVar40._12_4_;
          auVar40 = vmaxps_avx(auVar54,auVar60);
          auVar35 = vmaxps_avx(auVar35,auVar40);
          auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar21),auVar39,
                                    *(undefined1 (*) [16])(uVar11 + 0x20 + uVar21));
          auVar40 = vsubps_avx(auVar40,auVar91._0_16_);
          auVar55._0_4_ = fVar113 * auVar40._0_4_;
          auVar55._4_4_ = fVar121 * auVar40._4_4_;
          auVar55._8_4_ = fVar124 * auVar40._8_4_;
          auVar55._12_4_ = fVar126 * auVar40._12_4_;
          auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar13),auVar39,
                                    *(undefined1 (*) [16])(uVar11 + 0x20 + uVar13));
          auVar40 = vsubps_avx(auVar40,auVar92._0_16_);
          auVar61._0_4_ = fVar128 * auVar40._0_4_;
          auVar61._4_4_ = fVar117 * auVar40._4_4_;
          auVar61._8_4_ = fVar118 * auVar40._8_4_;
          auVar61._12_4_ = fVar119 * auVar40._12_4_;
          auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar17),auVar39,
                                    *(undefined1 (*) [16])(uVar11 + 0x20 + uVar17));
          auVar40 = vsubps_avx(auVar40,auVar98._0_16_);
          auVar69._0_4_ = fVar120 * auVar40._0_4_;
          auVar69._4_4_ = fVar123 * auVar40._4_4_;
          auVar69._8_4_ = fVar125 * auVar40._8_4_;
          auVar69._12_4_ = fVar127 * auVar40._12_4_;
          auVar40 = vminps_avx(auVar61,auVar69);
          auVar54 = vminps_avx(auVar38._0_16_,auVar55);
          auVar40 = vminps_avx(auVar54,auVar40);
          if (((uint)uVar20 & 7) == 6) {
            auVar54 = vcmpps_avx(auVar35,auVar40,2);
            auVar40 = vcmpps_avx(*(undefined1 (*) [16])(uVar11 + 0xe0),auVar39,2);
            auVar39 = vcmpps_avx(auVar39,*(undefined1 (*) [16])(uVar11 + 0xf0),1);
            auVar40 = vandps_avx(auVar40,auVar39);
            auVar40 = vandps_avx(auVar40,auVar54);
          }
          else {
            auVar40 = vcmpps_avx(auVar35,auVar40,2);
          }
          auVar40 = vpslld_avx(auVar40,0x1f);
          uVar15 = vmovmskps_avx(auVar40);
          k = (size_t)uVar15;
          local_10c0._0_16_ = auVar35;
        }
        if ((uVar20 & 8) == 0) {
          if (k == 0) {
            iVar9 = 4;
          }
          else {
            uVar11 = uVar20 & 0xfffffffffffffff0;
            lVar7 = 0;
            for (uVar20 = k; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
              lVar7 = lVar7 + 1;
            }
            iVar9 = 0;
            uVar24 = k - 1 & k;
            uVar20 = *(ulong *)(uVar11 + lVar7 * 8);
            if (uVar24 != 0) {
              uVar15 = *(uint *)(local_10c0 + lVar7 * 4);
              lVar7 = 0;
              for (uVar13 = uVar24; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                lVar7 = lVar7 + 1;
              }
              uVar24 = uVar24 - 1 & uVar24;
              uVar23 = *(ulong *)(uVar11 + lVar7 * 8);
              uVar3 = *(uint *)(local_10c0 + lVar7 * 4);
              uVar13 = local_13e8;
              uVar17 = local_13f0;
              if (uVar24 == 0) {
                if (uVar15 < uVar3) {
                  *(ulong *)*local_13f8 = uVar23;
                  *(uint *)(*local_13f8 + 8) = uVar3;
                  local_13f8 = local_13f8 + 1;
                }
                else {
                  *(ulong *)*local_13f8 = uVar20;
                  *(uint *)(*local_13f8 + 8) = uVar15;
                  uVar20 = uVar23;
                  local_13f8 = local_13f8 + 1;
                }
              }
              else {
                auVar35._8_8_ = 0;
                auVar35._0_8_ = uVar20;
                auVar35 = vpunpcklqdq_avx(auVar35,ZEXT416(uVar15));
                auVar50._8_8_ = 0;
                auVar50._0_8_ = uVar23;
                auVar40 = vpunpcklqdq_avx(auVar50,ZEXT416(uVar3));
                lVar7 = 0;
                for (uVar20 = uVar24; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000)
                {
                  lVar7 = lVar7 + 1;
                }
                uVar24 = uVar24 - 1 & uVar24;
                auVar56._8_8_ = 0;
                auVar56._0_8_ = *(ulong *)(uVar11 + lVar7 * 8);
                auVar39 = vpunpcklqdq_avx(auVar56,ZEXT416(*(uint *)(local_10c0 + lVar7 * 4)));
                auVar54 = vpcmpgtd_avx(auVar40,auVar35);
                if (uVar24 == 0) {
                  auVar55 = vpshufd_avx(auVar54,0xaa);
                  auVar54 = vblendvps_avx(auVar40,auVar35,auVar55);
                  auVar35 = vblendvps_avx(auVar35,auVar40,auVar55);
                  auVar40 = vpcmpgtd_avx(auVar39,auVar54);
                  auVar55 = vpshufd_avx(auVar40,0xaa);
                  auVar40 = vblendvps_avx(auVar39,auVar54,auVar55);
                  auVar54 = vblendvps_avx(auVar54,auVar39,auVar55);
                  auVar39 = vpcmpgtd_avx(auVar54,auVar35);
                  auVar55 = vpshufd_avx(auVar39,0xaa);
                  auVar39 = vblendvps_avx(auVar54,auVar35,auVar55);
                  auVar35 = vblendvps_avx(auVar35,auVar54,auVar55);
                  *local_13f8 = auVar35;
                  local_13f8[1] = auVar39;
                  uVar20 = auVar40._0_8_;
                  local_13f8 = local_13f8 + 2;
                }
                else {
                  lVar7 = 0;
                  for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                    lVar7 = lVar7 + 1;
                  }
                  auVar70._8_8_ = 0;
                  auVar70._0_8_ = *(ulong *)(uVar11 + lVar7 * 8);
                  auVar60 = vpunpcklqdq_avx(auVar70,ZEXT416(*(uint *)(local_10c0 + lVar7 * 4)));
                  auVar55 = vpshufd_avx(auVar54,0xaa);
                  auVar54 = vblendvps_avx(auVar40,auVar35,auVar55);
                  auVar35 = vblendvps_avx(auVar35,auVar40,auVar55);
                  auVar40 = vpcmpgtd_avx(auVar60,auVar39);
                  auVar55 = vpshufd_avx(auVar40,0xaa);
                  auVar40 = vblendvps_avx(auVar60,auVar39,auVar55);
                  auVar39 = vblendvps_avx(auVar39,auVar60,auVar55);
                  auVar55 = vpcmpgtd_avx(auVar39,auVar35);
                  auVar60 = vpshufd_avx(auVar55,0xaa);
                  auVar55 = vblendvps_avx(auVar39,auVar35,auVar60);
                  auVar35 = vblendvps_avx(auVar35,auVar39,auVar60);
                  auVar39 = vpcmpgtd_avx(auVar40,auVar54);
                  auVar60 = vpshufd_avx(auVar39,0xaa);
                  auVar39 = vblendvps_avx(auVar40,auVar54,auVar60);
                  auVar40 = vblendvps_avx(auVar54,auVar40,auVar60);
                  auVar54 = vpcmpgtd_avx(auVar55,auVar40);
                  auVar60 = vpshufd_avx(auVar54,0xaa);
                  auVar54 = vblendvps_avx(auVar55,auVar40,auVar60);
                  auVar40 = vblendvps_avx(auVar40,auVar55,auVar60);
                  *local_13f8 = auVar35;
                  local_13f8[1] = auVar40;
                  local_13f8[2] = auVar54;
                  auVar83 = ZEXT1664(local_12d0);
                  uVar20 = auVar39._0_8_;
                  local_13f8 = local_13f8 + 3;
                }
              }
            }
          }
        }
        else {
          iVar9 = 6;
        }
      } while (iVar9 == 0);
    } while (iVar9 != 6);
    local_1318 = (ulong)((uint)uVar20 & 0xf) - 8;
    local_1330 = k;
    if (local_1318 != 0) {
      uVar20 = uVar20 & 0xfffffffffffffff0;
      local_1308 = 0;
      pRVar14 = ray;
      sVar25 = sVar27;
      local_1400 = uVar20;
      do {
        ray = local_1320;
        sVar27 = local_1328;
        lVar12 = local_1308 * 0x50;
        pSVar4 = context->scene;
        pGVar5 = (pSVar4->geometries).items[*(uint *)(uVar20 + 0x30 + lVar12)].ptr;
        fVar99 = (pGVar5->time_range).lower;
        fVar99 = pGVar5->fnumTimeSegments *
                 ((*(float *)(pRVar14 + sVar25 * 4 + 0xe0) - fVar99) /
                 ((pGVar5->time_range).upper - fVar99));
        auVar35 = vroundss_avx(ZEXT416((uint)fVar99),ZEXT416((uint)fVar99),9);
        auVar35 = vminss_avx(auVar35,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
        auVar29 = vmaxss_avx(ZEXT816(0),auVar35);
        lVar16 = (long)(int)auVar29._0_4_ * 0x38;
        uVar28 = (ulong)*(uint *)(uVar20 + 4 + lVar12);
        lVar7 = *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar16);
        lVar16 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar16);
        auVar35 = *(undefined1 (*) [16])(lVar7 + (ulong)*(uint *)(uVar20 + lVar12) * 4);
        uVar13 = (ulong)*(uint *)(uVar20 + 0x10 + lVar12);
        auVar40 = *(undefined1 (*) [16])(lVar7 + uVar13 * 4);
        uVar18 = (ulong)*(uint *)(uVar20 + 0x20 + lVar12);
        auVar42 = *(undefined1 (*) [16])(lVar7 + uVar18 * 4);
        auVar54 = *(undefined1 (*) [16])(lVar7 + uVar28 * 4);
        uVar21 = (ulong)*(uint *)(local_1400 + 0x14 + lVar12);
        auVar39 = *(undefined1 (*) [16])(lVar7 + uVar21 * 4);
        uVar19 = (ulong)*(uint *)(local_1400 + 0x24 + lVar12);
        auVar43 = *(undefined1 (*) [16])(lVar7 + uVar19 * 4);
        uVar26 = (ulong)*(uint *)(local_1400 + 8 + lVar12);
        auVar55 = *(undefined1 (*) [16])(lVar7 + uVar26 * 4);
        uVar24 = (ulong)*(uint *)(local_1400 + 0x18 + lVar12);
        auVar60 = *(undefined1 (*) [16])(lVar7 + uVar24 * 4);
        uVar22 = (ulong)*(uint *)(local_1400 + 0x28 + lVar12);
        auVar61 = *(undefined1 (*) [16])(lVar7 + uVar22 * 4);
        uVar17 = (ulong)*(uint *)(local_1400 + 0xc + lVar12);
        auVar69 = *(undefined1 (*) [16])(lVar7 + uVar17 * 4);
        uVar23 = (ulong)*(uint *)(local_1400 + 0x1c + lVar12);
        auVar50 = *(undefined1 (*) [16])(lVar7 + uVar23 * 4);
        uVar11 = (ulong)*(uint *)(local_1400 + 0x2c + lVar12);
        auVar56 = *(undefined1 (*) [16])(lVar7 + uVar11 * 4);
        auVar70 = *(undefined1 (*) [16])(lVar16 + (ulong)*(uint *)(uVar20 + lVar12) * 4);
        auVar30 = *(undefined1 (*) [16])(lVar16 + uVar13 * 4);
        fVar99 = fVar99 - auVar29._0_4_;
        auVar29 = vunpcklps_avx(auVar35,auVar55);
        auVar55 = vunpckhps_avx(auVar35,auVar55);
        auVar31 = vunpcklps_avx(auVar54,auVar69);
        auVar54 = vunpckhps_avx(auVar54,auVar69);
        auVar35 = *(undefined1 (*) [16])(lVar16 + uVar28 * 4);
        auVar32 = vunpcklps_avx(auVar55,auVar54);
        auVar41 = vunpcklps_avx(auVar29,auVar31);
        auVar55 = vunpckhps_avx(auVar29,auVar31);
        auVar69 = vunpcklps_avx(auVar40,auVar60);
        auVar54 = vunpckhps_avx(auVar40,auVar60);
        auVar60 = vunpcklps_avx(auVar39,auVar50);
        auVar39 = vunpckhps_avx(auVar39,auVar50);
        auVar40 = *(undefined1 (*) [16])(lVar16 + uVar26 * 4);
        auVar50 = vunpcklps_avx(auVar54,auVar39);
        auVar29 = vunpcklps_avx(auVar69,auVar60);
        auVar39 = vunpckhps_avx(auVar69,auVar60);
        auVar69 = vunpcklps_avx(auVar42,auVar61);
        auVar60 = vunpckhps_avx(auVar42,auVar61);
        auVar31 = vunpcklps_avx(auVar43,auVar56);
        auVar61 = vunpckhps_avx(auVar43,auVar56);
        auVar54 = *(undefined1 (*) [16])(lVar16 + uVar17 * 4);
        auVar56 = vunpcklps_avx(auVar60,auVar61);
        auVar42 = vunpcklps_avx(auVar69,auVar31);
        auVar60 = vunpckhps_avx(auVar69,auVar31);
        auVar61 = vunpcklps_avx(auVar70,auVar40);
        auVar40 = vunpckhps_avx(auVar70,auVar40);
        auVar69 = vunpcklps_avx(auVar35,auVar54);
        auVar54 = vunpckhps_avx(auVar35,auVar54);
        auVar35 = *(undefined1 (*) [16])(lVar16 + uVar24 * 4);
        auVar70 = vunpcklps_avx(auVar40,auVar54);
        auVar31 = vunpcklps_avx(auVar61,auVar69);
        auVar54 = vunpckhps_avx(auVar61,auVar69);
        auVar69 = vunpcklps_avx(auVar30,auVar35);
        auVar61 = vunpckhps_avx(auVar30,auVar35);
        auVar35 = *(undefined1 (*) [16])(lVar16 + uVar21 * 4);
        auVar40 = *(undefined1 (*) [16])(lVar16 + uVar23 * 4);
        auVar30 = vunpcklps_avx(auVar35,auVar40);
        auVar35 = vunpckhps_avx(auVar35,auVar40);
        auVar43 = vunpcklps_avx(auVar61,auVar35);
        auVar51 = vunpcklps_avx(auVar69,auVar30);
        auVar61 = vunpckhps_avx(auVar69,auVar30);
        auVar35 = *(undefined1 (*) [16])(lVar16 + uVar18 * 4);
        auVar40 = *(undefined1 (*) [16])(lVar16 + uVar22 * 4);
        auVar30 = vunpcklps_avx(auVar35,auVar40);
        auVar69 = vunpckhps_avx(auVar35,auVar40);
        auVar35 = *(undefined1 (*) [16])(lVar16 + uVar19 * 4);
        auVar40 = *(undefined1 (*) [16])(lVar16 + uVar11 * 4);
        auVar52 = vunpcklps_avx(auVar35,auVar40);
        auVar35 = vunpckhps_avx(auVar35,auVar40);
        auVar40 = vunpcklps_avx(auVar69,auVar35);
        auVar69 = vunpcklps_avx(auVar30,auVar52);
        auVar35 = vunpckhps_avx(auVar30,auVar52);
        fVar101 = 1.0 - fVar99;
        auVar109._4_4_ = fVar101;
        auVar109._0_4_ = fVar101;
        auVar109._8_4_ = fVar101;
        auVar109._12_4_ = fVar101;
        auVar75._0_4_ = fVar99 * auVar31._0_4_;
        auVar75._4_4_ = fVar99 * auVar31._4_4_;
        auVar75._8_4_ = fVar99 * auVar31._8_4_;
        auVar75._12_4_ = fVar99 * auVar31._12_4_;
        auVar30 = vfmadd231ps_fma(auVar75,auVar109,auVar41);
        auVar93._0_4_ = fVar99 * auVar54._0_4_;
        auVar93._4_4_ = fVar99 * auVar54._4_4_;
        auVar93._8_4_ = fVar99 * auVar54._8_4_;
        auVar93._12_4_ = fVar99 * auVar54._12_4_;
        auVar54 = vfmadd231ps_fma(auVar93,auVar109,auVar55);
        auVar84._0_4_ = fVar99 * auVar70._0_4_;
        auVar84._4_4_ = fVar99 * auVar70._4_4_;
        auVar84._8_4_ = fVar99 * auVar70._8_4_;
        auVar84._12_4_ = fVar99 * auVar70._12_4_;
        auVar55 = vfmadd231ps_fma(auVar84,auVar109,auVar32);
        auVar71._0_4_ = fVar99 * auVar51._0_4_;
        auVar71._4_4_ = fVar99 * auVar51._4_4_;
        auVar71._8_4_ = fVar99 * auVar51._8_4_;
        auVar71._12_4_ = fVar99 * auVar51._12_4_;
        auVar70 = vfmadd231ps_fma(auVar71,auVar109,auVar29);
        auVar62._0_4_ = fVar99 * auVar61._0_4_;
        auVar62._4_4_ = fVar99 * auVar61._4_4_;
        auVar62._8_4_ = fVar99 * auVar61._8_4_;
        auVar62._12_4_ = fVar99 * auVar61._12_4_;
        auVar39 = vfmadd231ps_fma(auVar62,auVar109,auVar39);
        puVar1 = (undefined8 *)(local_1400 + 0x30 + lVar12);
        local_10f0 = *puVar1;
        uStack_10e8 = puVar1[1];
        puVar1 = (undefined8 *)(local_1400 + 0x40 + lVar12);
        auVar41._0_4_ = fVar99 * auVar43._0_4_;
        auVar41._4_4_ = fVar99 * auVar43._4_4_;
        auVar41._8_4_ = fVar99 * auVar43._8_4_;
        auVar41._12_4_ = fVar99 * auVar43._12_4_;
        auVar61 = vfmadd231ps_fma(auVar41,auVar109,auVar50);
        auVar51._0_4_ = fVar99 * auVar69._0_4_;
        auVar51._4_4_ = fVar99 * auVar69._4_4_;
        auVar51._8_4_ = fVar99 * auVar69._8_4_;
        auVar51._12_4_ = fVar99 * auVar69._12_4_;
        auVar57._0_4_ = fVar99 * auVar35._0_4_;
        auVar57._4_4_ = fVar99 * auVar35._4_4_;
        auVar57._8_4_ = fVar99 * auVar35._8_4_;
        auVar57._12_4_ = fVar99 * auVar35._12_4_;
        auVar100._0_4_ = fVar99 * auVar40._0_4_;
        auVar100._4_4_ = fVar99 * auVar40._4_4_;
        auVar100._8_4_ = fVar99 * auVar40._8_4_;
        auVar100._12_4_ = fVar99 * auVar40._12_4_;
        auVar69 = vfmadd231ps_fma(auVar51,auVar109,auVar42);
        auVar60 = vfmadd231ps_fma(auVar57,auVar109,auVar60);
        auVar50 = vfmadd231ps_fma(auVar100,auVar109,auVar56);
        local_12c0 = *puVar1;
        uStack_12b8 = puVar1[1];
        local_1280 = &local_1401;
        uVar10 = *(undefined4 *)(local_1320 + local_1328 * 4);
        auVar29._4_4_ = uVar10;
        auVar29._0_4_ = uVar10;
        auVar29._8_4_ = uVar10;
        auVar29._12_4_ = uVar10;
        uVar10 = *(undefined4 *)(local_1320 + local_1328 * 4 + 0x20);
        auVar114._4_4_ = uVar10;
        auVar114._0_4_ = uVar10;
        auVar114._8_4_ = uVar10;
        auVar114._12_4_ = uVar10;
        uVar10 = *(undefined4 *)(local_1320 + local_1328 * 4 + 0x40);
        auVar116._4_4_ = uVar10;
        auVar116._0_4_ = uVar10;
        auVar116._8_4_ = uVar10;
        auVar116._12_4_ = uVar10;
        local_13b0 = vsubps_avx(auVar30,auVar29);
        local_13c0 = vsubps_avx(auVar54,auVar114);
        local_1360 = vsubps_avx(auVar55,auVar116);
        auVar35 = vsubps_avx(auVar70,auVar29);
        auVar40 = vsubps_avx(auVar39,auVar114);
        auVar54 = vsubps_avx(auVar61,auVar116);
        auVar39 = vsubps_avx(auVar69,auVar29);
        auVar55 = vsubps_avx(auVar60,auVar114);
        auVar60 = vsubps_avx(auVar50,auVar116);
        local_1370 = vsubps_avx(auVar39,local_13b0);
        local_1100 = vsubps_avx(auVar55,local_13c0);
        local_1380 = vsubps_avx(auVar60,local_1360);
        auVar30._0_4_ = auVar39._0_4_ + local_13b0._0_4_;
        auVar30._4_4_ = auVar39._4_4_ + local_13b0._4_4_;
        auVar30._8_4_ = auVar39._8_4_ + local_13b0._8_4_;
        auVar30._12_4_ = auVar39._12_4_ + local_13b0._12_4_;
        auVar58._0_4_ = auVar55._0_4_ + local_13c0._0_4_;
        auVar58._4_4_ = auVar55._4_4_ + local_13c0._4_4_;
        auVar58._8_4_ = auVar55._8_4_ + local_13c0._8_4_;
        auVar58._12_4_ = auVar55._12_4_ + local_13c0._12_4_;
        fVar101 = local_1360._0_4_;
        auVar63._0_4_ = auVar60._0_4_ + fVar101;
        fVar102 = local_1360._4_4_;
        auVar63._4_4_ = auVar60._4_4_ + fVar102;
        fVar103 = local_1360._8_4_;
        auVar63._8_4_ = auVar60._8_4_ + fVar103;
        fVar104 = local_1360._12_4_;
        auVar63._12_4_ = auVar60._12_4_ + fVar104;
        auVar115._0_4_ = local_1380._0_4_ * auVar58._0_4_;
        auVar115._4_4_ = local_1380._4_4_ * auVar58._4_4_;
        auVar115._8_4_ = local_1380._8_4_ * auVar58._8_4_;
        auVar115._12_4_ = local_1380._12_4_ * auVar58._12_4_;
        auVar69 = vfmsub231ps_fma(auVar115,local_1100,auVar63);
        auVar64._0_4_ = local_1370._0_4_ * auVar63._0_4_;
        auVar64._4_4_ = local_1370._4_4_ * auVar63._4_4_;
        auVar64._8_4_ = local_1370._8_4_ * auVar63._8_4_;
        auVar64._12_4_ = local_1370._12_4_ * auVar63._12_4_;
        auVar61 = vfmsub231ps_fma(auVar64,local_1380,auVar30);
        auVar31._0_4_ = local_1100._0_4_ * auVar30._0_4_;
        auVar31._4_4_ = local_1100._4_4_ * auVar30._4_4_;
        auVar31._8_4_ = local_1100._8_4_ * auVar30._8_4_;
        auVar31._12_4_ = local_1100._12_4_ * auVar30._12_4_;
        auVar50 = vfmsub231ps_fma(auVar31,local_1370,auVar58);
        fVar99 = *(float *)(local_1320 + local_1328 * 4 + 0xc0);
        auVar52._0_4_ = fVar99 * auVar50._0_4_;
        auVar52._4_4_ = fVar99 * auVar50._4_4_;
        auVar52._8_4_ = fVar99 * auVar50._8_4_;
        auVar52._12_4_ = fVar99 * auVar50._12_4_;
        uVar10 = *(undefined4 *)(local_1320 + local_1328 * 4 + 0xa0);
        auVar94._4_4_ = uVar10;
        auVar94._0_4_ = uVar10;
        auVar94._8_4_ = uVar10;
        auVar94._12_4_ = uVar10;
        auVar61 = vfmadd231ps_fma(auVar52,auVar94,auVar61);
        uVar10 = *(undefined4 *)(local_1320 + local_1328 * 4 + 0x80);
        local_13e0._4_4_ = uVar10;
        local_13e0._0_4_ = uVar10;
        local_13e0._8_4_ = uVar10;
        local_13e0._12_4_ = uVar10;
        local_1140 = vfmadd231ps_fma(auVar61,local_13e0,auVar69);
        local_1110 = vsubps_avx(local_13c0,auVar40);
        local_1130 = vsubps_avx(local_1360,auVar54);
        auVar59._0_4_ = local_13c0._0_4_ + auVar40._0_4_;
        auVar59._4_4_ = local_13c0._4_4_ + auVar40._4_4_;
        auVar59._8_4_ = local_13c0._8_4_ + auVar40._8_4_;
        auVar59._12_4_ = local_13c0._12_4_ + auVar40._12_4_;
        auVar65._0_4_ = auVar54._0_4_ + fVar101;
        auVar65._4_4_ = auVar54._4_4_ + fVar102;
        auVar65._8_4_ = auVar54._8_4_ + fVar103;
        auVar65._12_4_ = auVar54._12_4_ + fVar104;
        fVar105 = local_1130._0_4_;
        auVar76._0_4_ = auVar59._0_4_ * fVar105;
        fVar107 = local_1130._4_4_;
        auVar76._4_4_ = auVar59._4_4_ * fVar107;
        fVar110 = local_1130._8_4_;
        auVar76._8_4_ = auVar59._8_4_ * fVar110;
        fVar112 = local_1130._12_4_;
        auVar76._12_4_ = auVar59._12_4_ * fVar112;
        auVar69 = vfmsub231ps_fma(auVar76,local_1110,auVar65);
        local_1120 = vsubps_avx(local_13b0,auVar35);
        fVar121 = local_1120._0_4_;
        auVar85._0_4_ = fVar121 * auVar65._0_4_;
        fVar124 = local_1120._4_4_;
        auVar85._4_4_ = fVar124 * auVar65._4_4_;
        fVar126 = local_1120._8_4_;
        auVar85._8_4_ = fVar126 * auVar65._8_4_;
        fVar128 = local_1120._12_4_;
        auVar85._12_4_ = fVar128 * auVar65._12_4_;
        auVar66._0_4_ = local_13b0._0_4_ + auVar35._0_4_;
        auVar66._4_4_ = local_13b0._4_4_ + auVar35._4_4_;
        auVar66._8_4_ = local_13b0._8_4_ + auVar35._8_4_;
        auVar66._12_4_ = local_13b0._12_4_ + auVar35._12_4_;
        auVar61 = vfmsub231ps_fma(auVar85,local_1130,auVar66);
        fVar106 = local_1110._0_4_;
        auVar67._0_4_ = auVar66._0_4_ * fVar106;
        fVar108 = local_1110._4_4_;
        auVar67._4_4_ = auVar66._4_4_ * fVar108;
        fVar111 = local_1110._8_4_;
        auVar67._8_4_ = auVar66._8_4_ * fVar111;
        fVar113 = local_1110._12_4_;
        auVar67._12_4_ = auVar66._12_4_ * fVar113;
        auVar50 = vfmsub231ps_fma(auVar67,local_1120,auVar59);
        auVar68._0_4_ = fVar99 * auVar50._0_4_;
        auVar68._4_4_ = fVar99 * auVar50._4_4_;
        auVar68._8_4_ = fVar99 * auVar50._8_4_;
        auVar68._12_4_ = fVar99 * auVar50._12_4_;
        auVar61 = vfmadd231ps_fma(auVar68,auVar94,auVar61);
        local_12a0 = vfmadd231ps_fma(auVar61,local_13e0,auVar69);
        auVar61 = vsubps_avx(auVar35,auVar39);
        auVar77._0_4_ = auVar39._0_4_ + auVar35._0_4_;
        auVar77._4_4_ = auVar39._4_4_ + auVar35._4_4_;
        auVar77._8_4_ = auVar39._8_4_ + auVar35._8_4_;
        auVar77._12_4_ = auVar39._12_4_ + auVar35._12_4_;
        auVar39 = vsubps_avx(auVar40,auVar55);
        auVar32._0_4_ = auVar40._0_4_ + auVar55._0_4_;
        auVar32._4_4_ = auVar40._4_4_ + auVar55._4_4_;
        auVar32._8_4_ = auVar40._8_4_ + auVar55._8_4_;
        auVar32._12_4_ = auVar40._12_4_ + auVar55._12_4_;
        auVar55 = vsubps_avx(auVar54,auVar60);
        auVar42._0_4_ = auVar54._0_4_ + auVar60._0_4_;
        auVar42._4_4_ = auVar54._4_4_ + auVar60._4_4_;
        auVar42._8_4_ = auVar54._8_4_ + auVar60._8_4_;
        auVar42._12_4_ = auVar54._12_4_ + auVar60._12_4_;
        auVar86._0_4_ = auVar32._0_4_ * auVar55._0_4_;
        auVar86._4_4_ = auVar32._4_4_ * auVar55._4_4_;
        auVar86._8_4_ = auVar32._8_4_ * auVar55._8_4_;
        auVar86._12_4_ = auVar32._12_4_ * auVar55._12_4_;
        auVar40 = vfmsub231ps_fma(auVar86,auVar39,auVar42);
        auVar43._0_4_ = auVar42._0_4_ * auVar61._0_4_;
        auVar43._4_4_ = auVar42._4_4_ * auVar61._4_4_;
        auVar43._8_4_ = auVar42._8_4_ * auVar61._8_4_;
        auVar43._12_4_ = auVar42._12_4_ * auVar61._12_4_;
        auVar35 = vfmsub231ps_fma(auVar43,auVar55,auVar77);
        auVar78._0_4_ = auVar39._0_4_ * auVar77._0_4_;
        auVar78._4_4_ = auVar39._4_4_ * auVar77._4_4_;
        auVar78._8_4_ = auVar39._8_4_ * auVar77._8_4_;
        auVar78._12_4_ = auVar39._12_4_ * auVar77._12_4_;
        auVar54 = vfmsub231ps_fma(auVar78,auVar61,auVar32);
        auVar79._0_4_ = fVar99 * auVar54._0_4_;
        auVar79._4_4_ = fVar99 * auVar54._4_4_;
        auVar79._8_4_ = fVar99 * auVar54._8_4_;
        auVar79._12_4_ = fVar99 * auVar54._12_4_;
        auVar35 = vfmadd231ps_fma(auVar79,auVar94,auVar35);
        auVar54 = vfmadd231ps_fma(auVar35,local_13e0,auVar40);
        local_12b0 = local_1140._0_4_;
        fStack_12ac = local_1140._4_4_;
        fStack_12a8 = local_1140._8_4_;
        fStack_12a4 = local_1140._12_4_;
        local_1290._0_4_ = auVar54._0_4_ + local_12b0 + local_12a0._0_4_;
        local_1290._4_4_ = auVar54._4_4_ + fStack_12ac + local_12a0._4_4_;
        local_1290._8_4_ = auVar54._8_4_ + fStack_12a8 + local_12a0._8_4_;
        local_1290._12_4_ = auVar54._12_4_ + fStack_12a4 + local_12a0._12_4_;
        auVar122._8_4_ = 0x7fffffff;
        auVar122._0_8_ = 0x7fffffff7fffffff;
        auVar122._12_4_ = 0x7fffffff;
        auVar35 = vminps_avx(local_1140,local_12a0);
        auVar35 = vminps_avx(auVar35,auVar54);
        local_1150 = vandps_avx(local_1290,auVar122);
        auVar95._0_4_ = local_1150._0_4_ * 1.1920929e-07;
        auVar95._4_4_ = local_1150._4_4_ * 1.1920929e-07;
        auVar95._8_4_ = local_1150._8_4_ * 1.1920929e-07;
        auVar95._12_4_ = local_1150._12_4_ * 1.1920929e-07;
        uVar13 = CONCAT44(auVar95._4_4_,auVar95._0_4_);
        auVar87._0_8_ = uVar13 ^ 0x8000000080000000;
        auVar87._8_4_ = -auVar95._8_4_;
        auVar87._12_4_ = -auVar95._12_4_;
        auVar35 = vcmpps_avx(auVar35,auVar87,5);
        auVar40 = vmaxps_avx(local_1140,local_12a0);
        auVar40 = vmaxps_avx(auVar40,auVar54);
        auVar40 = vcmpps_avx(auVar40,auVar95,2);
        local_13a0 = vorps_avx(auVar35,auVar40);
        uVar20 = local_1400;
        if ((((local_13a0 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (local_13a0 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (local_13a0 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            local_13a0[0xf] < '\0') {
          auVar44._0_4_ = fVar106 * local_1380._0_4_;
          auVar44._4_4_ = fVar108 * local_1380._4_4_;
          auVar44._8_4_ = fVar111 * local_1380._8_4_;
          auVar44._12_4_ = fVar113 * local_1380._12_4_;
          auVar80._0_4_ = fVar121 * local_1100._0_4_;
          auVar80._4_4_ = fVar124 * local_1100._4_4_;
          auVar80._8_4_ = fVar126 * local_1100._8_4_;
          auVar80._12_4_ = fVar128 * local_1100._12_4_;
          auVar54 = vfmsub213ps_fma(local_1100,local_1130,auVar44);
          auVar88._0_4_ = auVar39._0_4_ * fVar105;
          auVar88._4_4_ = auVar39._4_4_ * fVar107;
          auVar88._8_4_ = auVar39._8_4_ * fVar110;
          auVar88._12_4_ = auVar39._12_4_ * fVar112;
          auVar96._0_4_ = fVar121 * auVar55._0_4_;
          auVar96._4_4_ = fVar124 * auVar55._4_4_;
          auVar96._8_4_ = fVar126 * auVar55._8_4_;
          auVar96._12_4_ = fVar128 * auVar55._12_4_;
          auVar55 = vfmsub213ps_fma(auVar55,local_1110,auVar88);
          auVar35 = vandps_avx(auVar122,auVar44);
          auVar40 = vandps_avx(auVar122,auVar88);
          auVar35 = vcmpps_avx(auVar35,auVar40,1);
          local_1230 = vblendvps_avx(auVar55,auVar54,auVar35);
          auVar72._0_4_ = fVar106 * auVar61._0_4_;
          auVar72._4_4_ = fVar108 * auVar61._4_4_;
          auVar72._8_4_ = fVar111 * auVar61._8_4_;
          auVar72._12_4_ = fVar113 * auVar61._12_4_;
          auVar54 = vfmsub213ps_fma(auVar61,local_1130,auVar96);
          auVar89._0_4_ = local_1370._0_4_ * fVar105;
          auVar89._4_4_ = local_1370._4_4_ * fVar107;
          auVar89._8_4_ = local_1370._8_4_ * fVar110;
          auVar89._12_4_ = local_1370._12_4_ * fVar112;
          auVar55 = vfmsub213ps_fma(local_1380,local_1120,auVar89);
          auVar35 = vandps_avx(auVar122,auVar89);
          auVar40 = vandps_avx(auVar96,auVar122);
          auVar35 = vcmpps_avx(auVar35,auVar40,1);
          local_1220 = vblendvps_avx(auVar54,auVar55,auVar35);
          auVar54 = vfmsub213ps_fma(local_1370,local_1110,auVar80);
          auVar39 = vfmsub213ps_fma(auVar39,local_1120,auVar72);
          auVar35 = vandps_avx(auVar122,auVar80);
          auVar40 = vandps_avx(auVar122,auVar72);
          auVar35 = vcmpps_avx(auVar35,auVar40,1);
          local_1210 = vblendvps_avx(auVar39,auVar54,auVar35);
          auVar73._0_4_ = local_1210._0_4_ * fVar99;
          auVar73._4_4_ = local_1210._4_4_ * fVar99;
          auVar73._8_4_ = local_1210._8_4_ * fVar99;
          auVar73._12_4_ = local_1210._12_4_ * fVar99;
          auVar35 = vfmadd213ps_fma(auVar94,local_1220,auVar73);
          auVar35 = vfmadd213ps_fma(local_13e0,local_1230,auVar35);
          auVar74._0_4_ = auVar35._0_4_ + auVar35._0_4_;
          auVar74._4_4_ = auVar35._4_4_ + auVar35._4_4_;
          auVar74._8_4_ = auVar35._8_4_ + auVar35._8_4_;
          auVar74._12_4_ = auVar35._12_4_ + auVar35._12_4_;
          auVar81._0_4_ = local_1210._0_4_ * fVar101;
          auVar81._4_4_ = local_1210._4_4_ * fVar102;
          auVar81._8_4_ = local_1210._8_4_ * fVar103;
          auVar81._12_4_ = local_1210._12_4_ * fVar104;
          auVar35 = vfmadd213ps_fma(local_13c0,local_1220,auVar81);
          auVar40 = vfmadd213ps_fma(local_13b0,local_1230,auVar35);
          auVar35 = vrcpps_avx(auVar74);
          auVar97._8_4_ = 0x3f800000;
          auVar97._0_8_ = &DAT_3f8000003f800000;
          auVar97._12_4_ = 0x3f800000;
          auVar54 = vfnmadd213ps_fma(auVar35,auVar74,auVar97);
          auVar35 = vfmadd132ps_fma(auVar54,auVar35,auVar35);
          local_1240._0_4_ = auVar35._0_4_ * (auVar40._0_4_ + auVar40._0_4_);
          local_1240._4_4_ = auVar35._4_4_ * (auVar40._4_4_ + auVar40._4_4_);
          local_1240._8_4_ = auVar35._8_4_ * (auVar40._8_4_ + auVar40._8_4_);
          local_1240._12_4_ = auVar35._12_4_ * (auVar40._12_4_ + auVar40._12_4_);
          auVar38 = ZEXT1664(local_1240);
          uVar10 = *(undefined4 *)(local_1320 + local_1328 * 4 + 0x60);
          auVar82._4_4_ = uVar10;
          auVar82._0_4_ = uVar10;
          auVar82._8_4_ = uVar10;
          auVar82._12_4_ = uVar10;
          auVar35 = vcmpps_avx(auVar82,local_1240,2);
          uVar10 = *(undefined4 *)(local_1320 + local_1328 * 4 + 0x100);
          auVar90._4_4_ = uVar10;
          auVar90._0_4_ = uVar10;
          auVar90._8_4_ = uVar10;
          auVar90._12_4_ = uVar10;
          auVar40 = vcmpps_avx(local_1240,auVar90,2);
          auVar35 = vandps_avx(auVar35,auVar40);
          auVar54 = local_13a0 & auVar35;
          if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar54[0xf] < '\0') {
            auVar35 = vandps_avx(auVar35,local_13a0);
            auVar54 = vcmpps_avx(auVar74,_DAT_01feba10,4);
            auVar39 = auVar54 & auVar35;
            if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar39[0xf] < '\0') {
              local_1390 = vandps_avx(auVar35,auVar54);
              pRVar14 = &local_1401;
              local_1280 = pRVar14;
              local_1270 = local_1390;
              auVar35 = vrcpps_avx(local_1290);
              auVar53._8_4_ = 0x3f800000;
              auVar53._0_8_ = &DAT_3f8000003f800000;
              auVar53._12_4_ = 0x3f800000;
              auVar54 = vfnmadd213ps_fma(local_1290,auVar35,auVar53);
              auVar54 = vfmadd132ps_fma(auVar54,auVar35,auVar35);
              auVar45._8_4_ = 0x219392ef;
              auVar45._0_8_ = 0x219392ef219392ef;
              auVar45._12_4_ = 0x219392ef;
              auVar35 = vcmpps_avx(local_1150,auVar45,5);
              auVar35 = vandps_avx(auVar54,auVar35);
              auVar33._0_4_ = local_12b0 * auVar35._0_4_;
              auVar33._4_4_ = fStack_12ac * auVar35._4_4_;
              auVar33._8_4_ = fStack_12a8 * auVar35._8_4_;
              auVar33._12_4_ = fStack_12a4 * auVar35._12_4_;
              local_1260 = vminps_avx(auVar33,auVar53);
              auVar34._0_4_ = auVar35._0_4_ * local_12a0._0_4_;
              auVar34._4_4_ = auVar35._4_4_ * local_12a0._4_4_;
              auVar34._8_4_ = auVar35._8_4_ * local_12a0._8_4_;
              auVar34._12_4_ = auVar35._12_4_ * local_12a0._12_4_;
              local_1250 = vminps_avx(auVar34,auVar53);
              auVar46._8_4_ = 0x7f800000;
              auVar46._0_8_ = 0x7f8000007f800000;
              auVar46._12_4_ = 0x7f800000;
              auVar35 = vblendvps_avx(auVar46,local_1240,local_1390);
              auVar54 = vshufps_avx(auVar35,auVar35,0xb1);
              auVar54 = vminps_avx(auVar54,auVar35);
              auVar39 = vshufpd_avx(auVar54,auVar54,1);
              auVar54 = vminps_avx(auVar39,auVar54);
              auVar54 = vcmpps_avx(auVar35,auVar54,0);
              auVar39 = local_1390 & auVar54;
              auVar35 = vpcmpeqd_avx(auVar35,auVar35);
              if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar39[0xf] < '\0') {
                auVar35 = auVar54;
              }
              auVar35 = vandps_avx(local_1390,auVar35);
              auVar48 = vpcmpeqd_avx2(ZEXT1632(auVar40),ZEXT1632(auVar40));
              auVar83 = ZEXT3264(auVar48);
              local_1310 = pSVar4;
              do {
                auVar35 = vpslld_avx(auVar35,0x1f);
                uVar10 = vmovmskps_avx(auVar35);
                lVar7 = 0;
                for (uVar13 = CONCAT44((int)((ulong)pRVar14 >> 0x20),uVar10); (uVar13 & 1) == 0;
                    uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                  lVar7 = lVar7 + 1;
                }
                uVar15 = *(uint *)((long)&local_10f0 + lVar7 * 4);
                pRVar14 = (RayHitK<8> *)(ulong)uVar15;
                pGVar5 = (pSVar4->geometries).items[(long)pRVar14].ptr;
                if ((pGVar5->mask & *(uint *)(ray + sVar27 * 4 + 0x120)) == 0) {
                  *(undefined4 *)(local_1390 + lVar7 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar13 = (ulong)(uint)((int)lVar7 << 2);
                    uVar10 = *(undefined4 *)(local_1260 + uVar13);
                    uVar2 = *(undefined4 *)(local_1250 + uVar13);
                    *(undefined4 *)(ray + sVar27 * 4 + 0x100) = *(undefined4 *)(local_1240 + uVar13)
                    ;
                    *(undefined4 *)(ray + sVar27 * 4 + 0x180) = *(undefined4 *)(local_1230 + uVar13)
                    ;
                    *(undefined4 *)(ray + sVar27 * 4 + 0x1a0) = *(undefined4 *)(local_1220 + uVar13)
                    ;
                    *(undefined4 *)(ray + sVar27 * 4 + 0x1c0) = *(undefined4 *)(local_1210 + uVar13)
                    ;
                    *(undefined4 *)(ray + sVar27 * 4 + 0x1e0) = uVar10;
                    *(undefined4 *)(ray + sVar27 * 4 + 0x200) = uVar2;
                    *(undefined4 *)(ray + sVar27 * 4 + 0x220) =
                         *(undefined4 *)((long)&local_12c0 + uVar13);
                    *(uint *)(ray + sVar27 * 4 + 0x240) = uVar15;
                    *(uint *)(ray + sVar27 * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + sVar27 * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  uVar13 = (ulong)(uint)((int)lVar7 * 4);
                  local_1060 = *(undefined4 *)(local_1260 + uVar13);
                  local_1040 = *(undefined4 *)(local_1250 + uVar13);
                  local_1020 = *(undefined4 *)((long)&local_12c0 + uVar13);
                  uVar10 = *(undefined4 *)(local_1230 + uVar13);
                  local_10c0._4_4_ = uVar10;
                  local_10c0._0_4_ = uVar10;
                  local_10c0._8_4_ = uVar10;
                  local_10c0._12_4_ = uVar10;
                  local_10c0._16_4_ = uVar10;
                  local_10c0._20_4_ = uVar10;
                  local_10c0._24_4_ = uVar10;
                  local_10c0._28_4_ = uVar10;
                  uVar10 = *(undefined4 *)(local_1220 + uVar13);
                  local_10a0._4_4_ = uVar10;
                  local_10a0._0_4_ = uVar10;
                  local_10a0._8_4_ = uVar10;
                  local_10a0._12_4_ = uVar10;
                  local_10a0._16_4_ = uVar10;
                  local_10a0._20_4_ = uVar10;
                  local_10a0._24_4_ = uVar10;
                  local_10a0._28_4_ = uVar10;
                  uVar10 = *(undefined4 *)(local_1210 + uVar13);
                  local_1080._4_4_ = uVar10;
                  local_1080._0_4_ = uVar10;
                  local_1080._8_4_ = uVar10;
                  local_1080._12_4_ = uVar10;
                  local_1080._16_4_ = uVar10;
                  local_1080._20_4_ = uVar10;
                  local_1080._24_4_ = uVar10;
                  local_1080._28_4_ = uVar10;
                  local_1000._4_4_ = uVar15;
                  local_1000._0_4_ = uVar15;
                  local_1000._8_4_ = uVar15;
                  local_1000._12_4_ = uVar15;
                  local_1000._16_4_ = uVar15;
                  local_1000._20_4_ = uVar15;
                  local_1000._24_4_ = uVar15;
                  local_1000._28_4_ = uVar15;
                  uStack_105c = local_1060;
                  uStack_1058 = local_1060;
                  uStack_1054 = local_1060;
                  uStack_1050 = local_1060;
                  uStack_104c = local_1060;
                  uStack_1048 = local_1060;
                  uStack_1044 = local_1060;
                  uStack_103c = local_1040;
                  uStack_1038 = local_1040;
                  uStack_1034 = local_1040;
                  uStack_1030 = local_1040;
                  uStack_102c = local_1040;
                  uStack_1028 = local_1040;
                  uStack_1024 = local_1040;
                  uStack_101c = local_1020;
                  uStack_1018 = local_1020;
                  uStack_1014 = local_1020;
                  uStack_1010 = local_1020;
                  uStack_100c = local_1020;
                  uStack_1008 = local_1020;
                  uStack_1004 = local_1020;
                  uStack_fdc = context->user->instID[0];
                  local_fe0 = uStack_fdc;
                  uStack_fd8 = uStack_fdc;
                  uStack_fd4 = uStack_fdc;
                  uStack_fd0 = uStack_fdc;
                  uStack_fcc = uStack_fdc;
                  uStack_fc8 = uStack_fdc;
                  uStack_fc4 = uStack_fdc;
                  uStack_fbc = context->user->instPrimID[0];
                  local_fc0 = uStack_fbc;
                  uStack_fb8 = uStack_fbc;
                  uStack_fb4 = uStack_fbc;
                  uStack_fb0 = uStack_fbc;
                  uStack_fac = uStack_fbc;
                  uStack_fa8 = uStack_fbc;
                  uStack_fa4 = uStack_fbc;
                  uVar10 = *(undefined4 *)(ray + sVar27 * 4 + 0x100);
                  *(undefined4 *)(ray + sVar27 * 4 + 0x100) = *(undefined4 *)(local_1240 + uVar13);
                  local_1200 = local_10e0._0_8_;
                  uStack_11f8 = local_10e0._8_8_;
                  uStack_11f0 = local_10e0._16_8_;
                  uStack_11e8 = local_10e0._24_8_;
                  local_1300 = &local_1200;
                  local_12f8 = pGVar5->userPtr;
                  local_12f0 = context->user;
                  local_12e8 = ray;
                  local_12e0 = &local_10c0;
                  local_12d8 = 8;
                  pRVar14 = (RayHitK<8> *)pGVar5->intersectionFilterN;
                  if (pRVar14 != (RayHitK<8> *)0x0) {
                    local_13d0 = auVar38._0_16_;
                    local_13e0._0_4_ = uVar10;
                    auVar48 = ZEXT1632(auVar83._0_16_);
                    pRVar14 = (RayHitK<8> *)(*(code *)pRVar14)(&local_1300);
                    auVar38 = ZEXT1664(local_13d0);
                    auVar48 = vpcmpeqd_avx2(auVar48,auVar48);
                    auVar83 = ZEXT3264(auVar48);
                    uVar20 = local_1400;
                    uVar10 = local_13e0._0_4_;
                  }
                  auVar37._8_8_ = uStack_11f8;
                  auVar37._0_8_ = local_1200;
                  auVar37._16_8_ = uStack_11f0;
                  auVar37._24_8_ = uStack_11e8;
                  auVar37 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar37);
                  auVar48 = auVar83._0_32_ & ~auVar37;
                  if ((((((((auVar48 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar48 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar48 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar48 >> 0x7f,0) == '\0') &&
                        (auVar48 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar48 >> 0xbf,0) == '\0') &&
                      (auVar48 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar48[0x1f]) {
                    auVar37 = auVar37 ^ auVar83._0_32_;
                  }
                  else {
                    pRVar14 = (RayHitK<8> *)context->args->filter;
                    if ((pRVar14 != (RayHitK<8> *)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      local_13d0 = auVar38._0_16_;
                      local_13e0._0_4_ = uVar10;
                      auVar48 = ZEXT1632(auVar83._0_16_);
                      pRVar14 = (RayHitK<8> *)(*(code *)pRVar14)(&local_1300);
                      auVar38 = ZEXT1664(local_13d0);
                      auVar48 = vpcmpeqd_avx2(auVar48,auVar48);
                      auVar83 = ZEXT3264(auVar48);
                      uVar20 = local_1400;
                      uVar10 = local_13e0._0_4_;
                    }
                    auVar6._8_8_ = uStack_11f8;
                    auVar6._0_8_ = local_1200;
                    auVar6._16_8_ = uStack_11f0;
                    auVar6._24_8_ = uStack_11e8;
                    auVar6 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar6);
                    auVar37 = auVar6 ^ auVar83._0_32_;
                    auVar48 = auVar83._0_32_ & ~auVar6;
                    if ((((((((auVar48 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar48 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar48 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar48 >> 0x7f,0) != '\0') ||
                          (auVar48 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar48 >> 0xbf,0) != '\0') ||
                        (auVar48 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar48[0x1f] < '\0') {
                      auVar49._0_4_ = auVar6._0_4_ ^ auVar83._0_4_;
                      auVar49._4_4_ = auVar6._4_4_ ^ auVar83._4_4_;
                      auVar49._8_4_ = auVar6._8_4_ ^ auVar83._8_4_;
                      auVar49._12_4_ = auVar6._12_4_ ^ auVar83._12_4_;
                      auVar49._16_4_ = auVar6._16_4_ ^ auVar83._16_4_;
                      auVar49._20_4_ = auVar6._20_4_ ^ auVar83._20_4_;
                      auVar49._24_4_ = auVar6._24_4_ ^ auVar83._24_4_;
                      auVar49._28_4_ = auVar6._28_4_ ^ auVar83._28_4_;
                      auVar48 = vmaskmovps_avx(auVar49,*local_12e0);
                      *(undefined1 (*) [32])(local_12e8 + 0x180) = auVar48;
                      auVar48 = vmaskmovps_avx(auVar49,local_12e0[1]);
                      *(undefined1 (*) [32])(local_12e8 + 0x1a0) = auVar48;
                      auVar48 = vmaskmovps_avx(auVar49,local_12e0[2]);
                      *(undefined1 (*) [32])(local_12e8 + 0x1c0) = auVar48;
                      auVar48 = vmaskmovps_avx(auVar49,local_12e0[3]);
                      *(undefined1 (*) [32])(local_12e8 + 0x1e0) = auVar48;
                      auVar48 = vmaskmovps_avx(auVar49,local_12e0[4]);
                      *(undefined1 (*) [32])(local_12e8 + 0x200) = auVar48;
                      auVar48 = vpmaskmovd_avx2(auVar49,local_12e0[5]);
                      *(undefined1 (*) [32])(local_12e8 + 0x220) = auVar48;
                      auVar48 = vpmaskmovd_avx2(auVar49,local_12e0[6]);
                      *(undefined1 (*) [32])(local_12e8 + 0x240) = auVar48;
                      auVar48 = vpmaskmovd_avx2(auVar49,local_12e0[7]);
                      *(undefined1 (*) [32])(local_12e8 + 0x260) = auVar48;
                      auVar48 = vpmaskmovd_avx2(auVar49,local_12e0[8]);
                      *(undefined1 (*) [32])(local_12e8 + 0x280) = auVar48;
                      pRVar14 = local_12e8;
                    }
                  }
                  if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar37 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar37 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar37 >> 0x7f,0) == '\0') &&
                        (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar37 >> 0xbf,0) == '\0') &&
                      (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar37[0x1f]) {
                    *(undefined4 *)(ray + sVar27 * 4 + 0x100) = uVar10;
                  }
                  *(undefined4 *)(local_1390 + lVar7 * 4) = 0;
                  uVar10 = *(undefined4 *)(ray + sVar27 * 4 + 0x100);
                  auVar36._4_4_ = uVar10;
                  auVar36._0_4_ = uVar10;
                  auVar36._8_4_ = uVar10;
                  auVar36._12_4_ = uVar10;
                  auVar35 = vcmpps_avx(auVar38._0_16_,auVar36,2);
                  local_1390 = vandps_avx(auVar35,local_1390);
                }
                if ((((local_1390 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_1390 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_1390 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_1390[0xf]) break;
                auVar47._8_4_ = 0x7f800000;
                auVar47._0_8_ = 0x7f8000007f800000;
                auVar47._12_4_ = 0x7f800000;
                auVar35 = vblendvps_avx(auVar47,auVar38._0_16_,local_1390);
                auVar40 = vshufps_avx(auVar35,auVar35,0xb1);
                auVar40 = vminps_avx(auVar40,auVar35);
                auVar54 = vshufpd_avx(auVar40,auVar40,1);
                auVar40 = vminps_avx(auVar54,auVar40);
                auVar40 = vcmpps_avx(auVar35,auVar40,0);
                auVar54 = local_1390 & auVar40;
                auVar35 = local_1390;
                if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar54[0xf] < '\0') {
                  auVar35 = vandps_avx(auVar40,local_1390);
                }
                auVar35 = vpcmpgtd_avx(ZEXT816(0) << 0x20,auVar35);
              } while( true );
            }
          }
        }
        local_1308 = local_1308 + 1;
        pRVar14 = ray;
        sVar25 = sVar27;
      } while (local_1308 != local_1318);
    }
    uVar10 = *(undefined4 *)(ray + sVar27 * 4 + 0x100);
    auVar38 = ZEXT1664(CONCAT412(uVar10,CONCAT48(uVar10,CONCAT44(uVar10,uVar10))));
    auVar91 = ZEXT1664(local_1160);
    auVar92 = ZEXT1664(local_1170);
    auVar98 = ZEXT1664(local_1180);
    auVar83 = ZEXT1664(local_12d0);
    k = local_1330;
    uVar13 = local_13e8;
    uVar17 = local_13f0;
    uVar18 = local_1338;
    uVar19 = local_1340;
    uVar21 = local_1350;
    uVar22 = local_1348;
    fVar99 = local_1190;
    fVar101 = fStack_118c;
    fVar102 = fStack_1188;
    fVar103 = fStack_1184;
    fVar104 = local_11a0;
    fVar105 = fStack_119c;
    fVar106 = fStack_1198;
    fVar107 = fStack_1194;
    fVar108 = local_11b0;
    fVar110 = fStack_11ac;
    fVar111 = fStack_11a8;
    fVar112 = fStack_11a4;
    fVar113 = local_11c0;
    fVar121 = fStack_11bc;
    fVar124 = fStack_11b8;
    fVar126 = fStack_11b4;
    fVar128 = local_11d0;
    fVar117 = fStack_11cc;
    fVar118 = fStack_11c8;
    fVar119 = fStack_11c4;
    fVar120 = local_11e0;
    fVar123 = fStack_11dc;
    fVar125 = fStack_11d8;
    fVar127 = fStack_11d4;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }